

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

void __thiscall ON_SubD::ClearFragmentColors(ON_SubD *this,bool bClearFragmentColorsMappingTag)

{
  ON_SHA1_Hash hash;
  uint uVar1;
  ON_SubDimple *this_00;
  ON_SubDMeshFragment *local_b0;
  ON_SubDMeshFragment *frag;
  ON_SubDMeshFragmentIterator fragit;
  bool bFragmentsChanged;
  ON_SubDimple *subdimple;
  bool bClearFragmentColorsMappingTag_local;
  ON_SubD *this_local;
  
  this_00 = SubDimple(this);
  if (this_00 != (ON_SubDimple *)0x0) {
    fragit.m_half_size_fragment_count._3_1_ = 0;
    ON_SubDMeshFragmentIterator::ON_SubDMeshFragmentIterator
              ((ON_SubDMeshFragmentIterator *)&frag,this);
    local_b0 = ON_SubDMeshFragmentIterator::FirstFragment((ON_SubDMeshFragmentIterator *)&frag);
    while (local_b0 != (ON_SubDMeshFragment *)0x0) {
      if ((fragit.m_half_size_fragment_count._3_1_ & 1) == 0) {
        uVar1 = ON_SubDMeshFragment::ColorCount(local_b0);
        if (uVar1 != 0) {
          fragit.m_half_size_fragment_count._3_1_ = 1;
        }
      }
      ON_SubDMeshFragment::SetColorsExistForExperts(local_b0,false);
      local_b0 = ON_SubDMeshFragmentIterator::NextFragment((ON_SubDMeshFragmentIterator *)&frag);
    }
    if (bClearFragmentColorsMappingTag) {
      hash.m_digest[8] = ON_SHA1_Hash::EmptyContentHash.m_digest[8];
      hash.m_digest[9] = ON_SHA1_Hash::EmptyContentHash.m_digest[9];
      hash.m_digest[10] = ON_SHA1_Hash::EmptyContentHash.m_digest[10];
      hash.m_digest[0xb] = ON_SHA1_Hash::EmptyContentHash.m_digest[0xb];
      hash.m_digest[0xc] = ON_SHA1_Hash::EmptyContentHash.m_digest[0xc];
      hash.m_digest[0xd] = ON_SHA1_Hash::EmptyContentHash.m_digest[0xd];
      hash.m_digest[0xe] = ON_SHA1_Hash::EmptyContentHash.m_digest[0xe];
      hash.m_digest[0xf] = ON_SHA1_Hash::EmptyContentHash.m_digest[0xf];
      hash.m_digest[0] = ON_SHA1_Hash::EmptyContentHash.m_digest[0];
      hash.m_digest[1] = ON_SHA1_Hash::EmptyContentHash.m_digest[1];
      hash.m_digest[2] = ON_SHA1_Hash::EmptyContentHash.m_digest[2];
      hash.m_digest[3] = ON_SHA1_Hash::EmptyContentHash.m_digest[3];
      hash.m_digest[4] = ON_SHA1_Hash::EmptyContentHash.m_digest[4];
      hash.m_digest[5] = ON_SHA1_Hash::EmptyContentHash.m_digest[5];
      hash.m_digest[6] = ON_SHA1_Hash::EmptyContentHash.m_digest[6];
      hash.m_digest[7] = ON_SHA1_Hash::EmptyContentHash.m_digest[7];
      hash.m_digest[0x10] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x10];
      hash.m_digest[0x11] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x11];
      hash.m_digest[0x12] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x12];
      hash.m_digest[0x13] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x13];
      ON_SubDimple::Internal_SetFragmentColorsSettingsHash(this_00,hash);
      SetColorsMappingTag(this,&ON_MappingTag::Unset);
    }
    if ((fragit.m_half_size_fragment_count._3_1_ & 1) != 0) {
      ChangeRenderContentSerialNumber(this);
    }
    ON_SubDMeshFragmentIterator::~ON_SubDMeshFragmentIterator((ON_SubDMeshFragmentIterator *)&frag);
  }
  return;
}

Assistant:

void ON_SubD::ClearFragmentColors(
  bool bClearFragmentColorsMappingTag
)
{
  const ON_SubDimple* subdimple = this->SubDimple();
  if (nullptr != subdimple)
  {
    bool bFragmentsChanged = false;
    ON_SubDMeshFragmentIterator fragit(*this);
    for (const ON_SubDMeshFragment* frag = fragit.FirstFragment(); nullptr != frag; frag = fragit.NextFragment())
    {
      if (false == bFragmentsChanged && frag->ColorCount() > 0)
        bFragmentsChanged = true;
      frag->SetColorsExistForExperts(false);
    }
    if (bClearFragmentColorsMappingTag)
    {
      subdimple->Internal_SetFragmentColorsSettingsHash(ON_SHA1_Hash::EmptyContentHash);
      this->SetColorsMappingTag(ON_MappingTag::Unset);
    }
    if (bFragmentsChanged)
      this->ChangeRenderContentSerialNumber();
  }
}